

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutex.h
# Opt level: O0

void icu_63::umtx_storeRelease(u_atomic_int32_t *var,int32_t val)

{
  int32_t val_local;
  u_atomic_int32_t *var_local;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  (var->super___atomic_base<int>)._M_i = val;
  return;
}

Assistant:

inline void umtx_storeRelease(u_atomic_int32_t &var, int32_t val) {
    var.store(val, std::memory_order_release);
}